

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::
write_significand<fmt::v11::basic_appender<char>,char,unsigned_long,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,unsigned_long significand,int significand_size,int integral_size
          ,char decimal_point,digit_grouping<char> *grouping)

{
  basic_appender<char> bVar1;
  basic_string_view<char> digits;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> buffer;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> local_230;
  
  if ((grouping->thousands_sep_)._M_string_length != 0) {
    local_230.super_buffer<char>.ptr_ = local_230.store_;
    local_230.super_buffer<char>.size_ = 0;
    local_230.super_buffer<char>.grow_ =
         basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
    local_230.super_buffer<char>.capacity_ = 500;
    write_significand<fmt::v11::basic_appender<char>,_unsigned_long,_char,_0>
              (&local_230.super_buffer<char>,significand,significand_size,integral_size,
               decimal_point);
    digits.size_._0_4_ = integral_size;
    digits.data_ = local_230.super_buffer<char>.ptr_;
    digits.size_._4_4_ = 0;
    digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>(grouping,out,digits);
    bVar1 = copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                      (local_230.super_buffer<char>.ptr_ + integral_size,
                       local_230.super_buffer<char>.ptr_ + local_230.super_buffer<char>.size_,out);
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::deallocate(&local_230);
    return (basic_appender<char>)bVar1.container;
  }
  bVar1 = write_significand<fmt::v11::basic_appender<char>,_unsigned_long,_char,_0>
                    (out,significand,significand_size,integral_size,decimal_point);
  return (basic_appender<char>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(basic_appender<Char>(buffer), significand, significand_size,
                    integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_noinline<Char>(buffer.data() + integral_size,
                                     buffer.end(), out);
}